

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,OpenMDBitSet *bs)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  ostream *in_RDI;
  string val;
  size_t i;
  ostream *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [32];
  ulong local_18;
  ostream *local_8;
  
  local_8 = in_RDI;
  for (local_18 = 0; uVar1 = local_18,
      sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc0),
      uVar1 < sVar2; local_18 = local_18 + 1) {
    OpenMDBitSet::operator[]
              ((OpenMDBitSet *)in_stack_ffffffffffffff80,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    poVar3 = std::operator<<(local_8,"OpenMDBitSet[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    in_stack_ffffffffffffff80 = std::operator<<(poVar3,"] = ");
    in_stack_ffffffffffffff78 = std::operator<<(in_stack_ffffffffffffff80,local_38);
    std::ostream::operator<<(in_stack_ffffffffffffff78,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const OpenMDBitSet& bs) {
    for (size_t i = 0; i < bs.bitset_.size(); ++i) {
      std::string val = bs[i] ? "true" : "false";
      os << "OpenMDBitSet[" << i << "] = " << val << std::endl;
    }

    return os;
  }